

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

Instruction * __thiscall spv::Block::getMergeInstruction(Block *this)

{
  Op OVar1;
  size_type sVar2;
  pointer this_00;
  __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
  local_30;
  __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
  local_28;
  Block *local_20;
  Instruction *nextToLast;
  Block *this_local;
  
  nextToLast = (Instruction *)this;
  sVar2 = std::
          vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
          ::size(&this->instructions);
  if (sVar2 < 2) {
    this_local = (Block *)0x0;
  }
  else {
    local_30._M_current =
         (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
         std::
         vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
         ::cend(&this->instructions);
    local_28 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
               ::operator-(&local_30,2);
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
              ::operator->(&local_28);
    local_20 = (Block *)std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                        get(this_00);
    OVar1 = Instruction::getOpCode((Instruction *)local_20);
    if (OVar1 == OpLoopMerge || OVar1 == OpSelectionMerge) {
      this_local = local_20;
    }
    else {
      this_local = (Block *)0x0;
    }
  }
  return (Instruction *)this_local;
}

Assistant:

const Instruction* getMergeInstruction() const {
        if (instructions.size() < 2) return nullptr;
        const Instruction* nextToLast = (instructions.cend() - 2)->get();
        switch (nextToLast->getOpCode()) {
            case OpSelectionMerge:
            case OpLoopMerge:
                return nextToLast;
            default:
                return nullptr;
        }
        return nullptr;
    }